

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,OpInst *i)

{
  bool bVar1;
  Codegen *pCVar2;
  Operand2 *__args_3;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *this_00;
  long in_RSI;
  long in_RDI;
  Value *rhs;
  Value *lhs;
  bool reverse_params;
  VarId *in_stack_fffffffffffff948;
  VarId *other;
  Value *in_stack_fffffffffffff950;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_01;
  unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *in_stack_fffffffffffff958;
  unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *__u;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *in_stack_fffffffffffff960;
  VarId *in_stack_fffffffffffff968;
  Codegen *in_stack_fffffffffffff970;
  Operand2 *in_stack_fffffffffffff9a8;
  Operand2 *in_stack_fffffffffffff9b0;
  OpCode *in_stack_fffffffffffff9b8;
  uint *in_stack_fffffffffffff9c0;
  __node_base *__args_1;
  OpCode *in_stack_fffffffffffff9c8;
  _Base_ptr *__args;
  Value *in_stack_fffffffffffff9d0;
  Codegen *in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  Op op;
  Value *in_stack_fffffffffffffa00;
  Codegen *in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffab0;
  undefined2 uVar3;
  ConditionCode cond;
  Value *in_stack_fffffffffffffab8;
  Value *in_stack_fffffffffffffac0;
  VarId *in_stack_fffffffffffffac8;
  Codegen *in_stack_fffffffffffffad0;
  long local_480;
  long local_478;
  bool local_469;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  local_460;
  Reg local_43c;
  VarId local_438;
  Reg local_428;
  undefined4 local_424;
  unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> local_420 [6];
  Reg local_3ec;
  Codegen local_3e8;
  Reg local_1c0;
  undefined4 local_1bc;
  Reg local_194;
  Reg local_180;
  undefined4 local_17c;
  Reg local_154;
  Reg local_140;
  undefined4 local_13c;
  Reg local_104;
  Reg local_f0;
  undefined4 local_ec;
  Reg local_b4;
  Reg local_a0;
  undefined4 local_9c;
  Reg local_54;
  Reg local_40;
  undefined4 local_3c;
  long local_28;
  long local_20;
  bool local_11;
  long local_10;
  
  uVar3 = (undefined2)((ulong)in_stack_fffffffffffffab0 >> 0x30);
  op = (Op)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  local_10 = in_RSI;
  bVar1 = mir::inst::Value::is_immediate((Value *)0x20fce8);
  if ((!bVar1) || (bVar1 = mir::inst::Value::is_immediate((Value *)0x20fcff), bVar1)) {
    bVar1 = mir::inst::Value::is_immediate((Value *)0x20fd19);
    local_469 = false;
    if (bVar1) goto LAB_0020fda5;
    bVar1 = mir::inst::Value::is_immediate((Value *)0x20fd3a);
    local_469 = false;
    if (bVar1) goto LAB_0020fda5;
    bVar1 = mir::inst::Value::has_shift(in_stack_fffffffffffff950);
    local_469 = false;
    if (!bVar1) goto LAB_0020fda5;
    bVar1 = mir::inst::Value::has_shift(in_stack_fffffffffffff950);
    local_469 = false;
    if (bVar1) goto LAB_0020fda5;
  }
  local_469 = can_reverse_param(op);
LAB_0020fda5:
  local_11 = local_469;
  if (local_469 == false) {
    local_478 = local_10 + 0x18;
  }
  else {
    local_478 = local_10 + 0x38;
  }
  local_20 = local_478;
  if (local_469 == false) {
    local_480 = local_10 + 0x38;
  }
  else {
    local_480 = local_10 + 0x18;
  }
  local_28 = local_480;
  bVar1 = SUB21(uVar3,0);
  cond = (ConditionCode)((ushort)uVar3 >> 8);
  switch(*(undefined4 *)(local_10 + 0x58)) {
  case 0:
    local_3c = 9;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_40 = translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_54 = translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 1:
    if (local_469 == false) {
      local_ec = 10;
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      local_f0 = translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      local_104 = translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
      std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
                (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                 in_stack_fffffffffffff9b0);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
                (in_stack_fffffffffffff960,
                 (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
                 in_stack_fffffffffffff958);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                (in_stack_fffffffffffff960);
      std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
                 in_stack_fffffffffffff950);
    }
    else {
      local_9c = 0xb;
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      local_a0 = translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      local_b4 = translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
      std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
                (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                 in_stack_fffffffffffff9b0);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
                (in_stack_fffffffffffff960,
                 (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
                 in_stack_fffffffffffff958);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                (in_stack_fffffffffffff960);
      std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
                 in_stack_fffffffffffff950);
    }
    break;
  case 2:
    local_13c = 0xc;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_140 = translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_154 = translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    arm::RegisterOperand::RegisterOperand
              ((RegisterOperand *)in_stack_fffffffffffff950,
               (Reg)((ulong)in_stack_fffffffffffff948 >> 0x20));
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::RegisterOperand>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (RegisterOperand *)in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 3:
    local_1bc = 0x10;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_1c0 = translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_3e8.vreg_vq_counter =
         translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    arm::RegisterOperand::RegisterOperand
              ((RegisterOperand *)in_stack_fffffffffffff950,
               (Reg)((ulong)in_stack_fffffffffffff948 >> 0x20));
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::RegisterOperand>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (RegisterOperand *)in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 4:
    local_17c = 0xd;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_180 = translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_194 = translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    arm::RegisterOperand::RegisterOperand
              ((RegisterOperand *)in_stack_fffffffffffff950,
               (Reg)((ulong)in_stack_fffffffffffff948 >> 0x20));
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::RegisterOperand>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (RegisterOperand *)in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 5:
    this_00 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)(in_RDI + 0x18);
    local_424 = 0x22;
    other = &local_438;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,other);
    local_428 = translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_43c = translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    this_01 = &local_460;
    translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    __u = local_420;
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>(this_00,__u);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back(this_01,(value_type *)other);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr(this_00);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)this_01);
    break;
  case 6:
    emit_compare(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffab8,cond,bVar1);
    break;
  case 7:
    emit_compare(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffab8,cond,bVar1);
    break;
  case 8:
    emit_compare(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffab8,cond,bVar1);
    break;
  case 9:
    emit_compare(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffab8,cond,bVar1);
    break;
  case 10:
    emit_compare(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffab8,cond,bVar1);
    break;
  case 0xb:
    emit_compare(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffab8,cond,bVar1);
    break;
  case 0xc:
    local_3e8.last_jump.super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
    super__Optional_payload_base<backend::codegen::LastJump>._M_payload._0_4_ = 0x11;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_3e8._488_4_ = translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_3e8.inline_hint._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
         translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 0xd:
    local_3e8.stack_space_allocation._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x12;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_3e8.stack_space_allocation._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_3e8.stack_space_allocation._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
         translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 0xe:
    local_3e8.phi_reg._M_h._M_before_begin._M_nxt._4_4_ = 0x13;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_3e8.phi_reg._M_h._M_before_begin._M_nxt._0_4_ =
         translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_3e8.fixed_vars._M_h._M_single_bucket._4_4_ =
         translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 0xf:
    local_3e8.var_collapse._M_h._M_single_bucket._4_4_ = 8;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_3e8.var_collapse._M_h._M_single_bucket._0_4_ =
         translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2>
              (in_stack_fffffffffffff9b8,(uint *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8
              );
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
              (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 0x10:
    pCVar2 = (Codegen *)(in_RDI + 0x18);
    local_3e8.var_use._M_h._M_rehash_policy._4_4_ = 0x15;
    __args_1 = &local_3e8.var_use._M_h._M_before_begin;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_3e8.var_use._M_h._M_rehash_policy._M_max_load_factor =
         (float)translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_3e8.var_use._M_h._M_bucket_count._4_4_ =
         translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    __args = (_Base_ptr *)
             ((long)&local_3e8.consts._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    translate_value_to_operand2(pCVar2,in_stack_fffffffffffff9d0);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)__args,(uint *)__args_1,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0
              );
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 0x11:
    __args_3 = (Operand2 *)(in_RDI + 0x18);
    local_3e8.consts._M_t._M_impl._4_4_ = 0x16;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_3e8.consts._M_t._M_impl._0_4_ =
         translate_var_reg(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_3e8.reg_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
         translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               __args_3);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
    break;
  case 0x12:
    local_3e8.extra_data._4_4_ = 0x17;
    pCVar2 = &local_3e8;
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    local_3e8.extra_data._0_4_ = translate_var_reg(pCVar2,in_stack_fffffffffffff968);
    local_3ec = translate_value_to_reg(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    translate_value_to_operand2(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               in_stack_fffffffffffff9b0);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              (in_stack_fffffffffffff960,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff958);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_fffffffffffff960);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff950);
  }
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::OpInst& i) {
  // Reverse when:
  //  - lhs is immediate
  //  - lhs is variable with shift and rhs is regular variable
  bool reverse_params = ((i.lhs.is_immediate() && !i.rhs.is_immediate()) ||
                         (!i.lhs.is_immediate() && !i.rhs.is_immediate() &&
                          i.lhs.has_shift() && !i.rhs.has_shift())) &&
                        can_reverse_param(i.op);

  mir::inst::Value& lhs = reverse_params ? i.rhs : i.lhs;
  mir::inst::Value& rhs = reverse_params ? i.lhs : i.rhs;

  switch (i.op) {
    case mir::inst::Op::Add:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Add, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Sub:
      if (reverse_params) {
        inst.push_back(std::make_unique<Arith3Inst>(
            arm::OpCode::Rsb, translate_var_reg(i.dest),
            translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      } else {
        inst.push_back(std::make_unique<Arith3Inst>(
            arm::OpCode::Sub, translate_var_reg(i.dest),
            translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      }
      break;

    case mir::inst::Op::Mul:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Mul, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::MulSh:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::SMMul, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::Div:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::SDiv, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::And:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::And, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Or:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Orr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Xor:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Eor, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Not:
      inst.push_back(std::make_unique<Arith2Inst>(
          arm::OpCode::Mvn, translate_var_reg(i.dest),
          translate_value_to_operand2(lhs)));
      break;

    case mir::inst::Op::Shl:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Lsl, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Shr:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Lsr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::ShrA:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Asr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Rem:
      // WARN: Mod is a pseudo-instruction!
      // Mod operations needs to be eliminated in later passes.
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::_Mod, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;
    case mir::inst::Op::Gt:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Gt, reverse_params);
      break;
    case mir::inst::Op::Lt:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Lt, reverse_params);
      break;
    case mir::inst::Op::Gte:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Ge, reverse_params);
      break;
    case mir::inst::Op::Lte:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Le, reverse_params);
      break;
    case mir::inst::Op::Eq:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Equal, reverse_params);
      break;
    case mir::inst::Op::Neq:
      emit_compare(i.dest, lhs, rhs, ConditionCode::NotEqual, reverse_params);
      break;
  }
}